

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_id.cc
# Opt level: O2

char * __thiscall Env::RValue(Env *this,ID *id)

{
  IDRecord *this_00;
  char *pcVar1;
  ExceptionIDNotFound *this_01;
  
  this_00 = lookup(this,id,true,false);
  if (this_00 != (IDRecord *)0x0) {
    pcVar1 = IDRecord::RValue(this_00);
    return pcVar1;
  }
  if (this->allow_undefined_id_ == true) {
    return (id->name)._M_dataplus._M_p;
  }
  this_01 = (ExceptionIDNotFound *)__cxa_allocate_exception(0x28);
  ExceptionIDNotFound::ExceptionIDNotFound(this_01,id);
  __cxa_throw(this_01,&ExceptionIDNotFound::typeinfo,Exception::~Exception);
}

Assistant:

const char* Env::RValue(const ID* id) const
	{
	IDRecord* r = lookup(id, true, false);
	if ( r )
		return r->RValue();
	else
		{
		if ( allow_undefined_id() )
			return id->Name();
		else
			throw ExceptionIDNotFound(id);
		}
	}